

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

void __thiscall restincurl::Client::Client(Client *this,bool init)

{
  Worker *this_00;
  anon_class_1_0_00000001 local_21;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_00110b28;
  this_00 = (Worker *)operator_new(0xd0);
  memset(this_00,0,0xd0);
  Worker::Worker(this_00);
  (this->worker_)._M_t.
  super___uniq_ptr_impl<restincurl::Worker,_std::default_delete<restincurl::Worker>_>._M_t.
  super__Tuple_impl<0UL,_restincurl::Worker_*,_std::default_delete<restincurl::Worker>_>.
  super__Head_base<0UL,_restincurl::Worker_*,_false>._M_head_impl = this_00;
  if (init) {
    std::call_once<restincurl::Client::Client(bool)::_lambda()_1_>(&Client::flag,&local_21);
  }
  return;
}

Assistant:

Client(const bool init = true) {
            if (init) {
                static std::once_flag flag;
                std::call_once(flag, [] {
                    RESTINCURL_LOG("One time initialization of curl.");
                    curl_global_init(CURL_GLOBAL_DEFAULT);
                });
            }
        }